

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_names.c
# Opt level: O0

int dwarf_get_TAG_name(uint val,char **s_out)

{
  char **s_out_local;
  uint val_local;
  
  if (val == 1) {
    *s_out = "DW_TAG_array_type";
    s_out_local._4_4_ = 0;
  }
  else if (val == 2) {
    *s_out = "DW_TAG_class_type";
    s_out_local._4_4_ = 0;
  }
  else if (val == 3) {
    *s_out = "DW_TAG_entry_point";
    s_out_local._4_4_ = 0;
  }
  else if (val == 4) {
    *s_out = "DW_TAG_enumeration_type";
    s_out_local._4_4_ = 0;
  }
  else if (val == 5) {
    *s_out = "DW_TAG_formal_parameter";
    s_out_local._4_4_ = 0;
  }
  else if (val == 8) {
    *s_out = "DW_TAG_imported_declaration";
    s_out_local._4_4_ = 0;
  }
  else if (val == 10) {
    *s_out = "DW_TAG_label";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0xb) {
    *s_out = "DW_TAG_lexical_block";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0xd) {
    *s_out = "DW_TAG_member";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0xf) {
    *s_out = "DW_TAG_pointer_type";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x10) {
    *s_out = "DW_TAG_reference_type";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x11) {
    *s_out = "DW_TAG_compile_unit";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x12) {
    *s_out = "DW_TAG_string_type";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x13) {
    *s_out = "DW_TAG_structure_type";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x15) {
    *s_out = "DW_TAG_subroutine_type";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x16) {
    *s_out = "DW_TAG_typedef";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x17) {
    *s_out = "DW_TAG_union_type";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x18) {
    *s_out = "DW_TAG_unspecified_parameters";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x19) {
    *s_out = "DW_TAG_variant";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x1a) {
    *s_out = "DW_TAG_common_block";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x1b) {
    *s_out = "DW_TAG_common_inclusion";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x1c) {
    *s_out = "DW_TAG_inheritance";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x1d) {
    *s_out = "DW_TAG_inlined_subroutine";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x1e) {
    *s_out = "DW_TAG_module";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x1f) {
    *s_out = "DW_TAG_ptr_to_member_type";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x20) {
    *s_out = "DW_TAG_set_type";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x21) {
    *s_out = "DW_TAG_subrange_type";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x22) {
    *s_out = "DW_TAG_with_stmt";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x23) {
    *s_out = "DW_TAG_access_declaration";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x24) {
    *s_out = "DW_TAG_base_type";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x25) {
    *s_out = "DW_TAG_catch_block";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x26) {
    *s_out = "DW_TAG_const_type";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x27) {
    *s_out = "DW_TAG_constant";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x28) {
    *s_out = "DW_TAG_enumerator";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x29) {
    *s_out = "DW_TAG_file_type";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x2a) {
    *s_out = "DW_TAG_friend";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x2b) {
    *s_out = "DW_TAG_namelist";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x2c) {
    *s_out = "DW_TAG_namelist_item";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x2d) {
    *s_out = "DW_TAG_packed_type";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x2e) {
    *s_out = "DW_TAG_subprogram";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x2f) {
    *s_out = "DW_TAG_template_type_parameter";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x30) {
    *s_out = "DW_TAG_template_value_parameter";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x31) {
    *s_out = "DW_TAG_thrown_type";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x32) {
    *s_out = "DW_TAG_try_block";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x33) {
    *s_out = "DW_TAG_variant_part";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x34) {
    *s_out = "DW_TAG_variable";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x35) {
    *s_out = "DW_TAG_volatile_type";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x36) {
    *s_out = "DW_TAG_dwarf_procedure";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x37) {
    *s_out = "DW_TAG_restrict_type";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x38) {
    *s_out = "DW_TAG_interface_type";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x39) {
    *s_out = "DW_TAG_namespace";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x3a) {
    *s_out = "DW_TAG_imported_module";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x3b) {
    *s_out = "DW_TAG_unspecified_type";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x3c) {
    *s_out = "DW_TAG_partial_unit";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x3d) {
    *s_out = "DW_TAG_imported_unit";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x3e) {
    *s_out = "DW_TAG_mutable_type";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x3f) {
    *s_out = "DW_TAG_condition";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x40) {
    *s_out = "DW_TAG_shared_type";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x41) {
    *s_out = "DW_TAG_type_unit";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x42) {
    *s_out = "DW_TAG_rvalue_reference_type";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x43) {
    *s_out = "DW_TAG_template_alias";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x44) {
    *s_out = "DW_TAG_coarray_type";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x45) {
    *s_out = "DW_TAG_generic_subrange";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x46) {
    *s_out = "DW_TAG_dynamic_type";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x47) {
    *s_out = "DW_TAG_atomic_type";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x48) {
    *s_out = "DW_TAG_call_site";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x49) {
    *s_out = "DW_TAG_call_site_parameter";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x4a) {
    *s_out = "DW_TAG_skeleton_unit";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x4b) {
    *s_out = "DW_TAG_immutable_type";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x4080) {
    *s_out = "DW_TAG_TI_far_type";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x4081) {
    *s_out = "DW_TAG_MIPS_loop";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x4082) {
    *s_out = "DW_TAG_TI_assign_register";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x4083) {
    *s_out = "DW_TAG_TI_ioport_type";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x4084) {
    *s_out = "DW_TAG_TI_restrict_type";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x4085) {
    *s_out = "DW_TAG_TI_onchip_type";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x4090) {
    *s_out = "DW_TAG_HP_array_descriptor";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x4101) {
    *s_out = "DW_TAG_format_label";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x4102) {
    *s_out = "DW_TAG_function_template";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x4103) {
    *s_out = "DW_TAG_class_template";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x4104) {
    *s_out = "DW_TAG_GNU_BINCL";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x4105) {
    *s_out = "DW_TAG_GNU_EINCL";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x4106) {
    *s_out = "DW_TAG_GNU_template_template_parameter";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x4107) {
    *s_out = "DW_TAG_GNU_template_parameter_pack";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x4108) {
    *s_out = "DW_TAG_GNU_formal_parameter_pack";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x4109) {
    *s_out = "DW_TAG_GNU_call_site";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x410a) {
    *s_out = "DW_TAG_GNU_call_site_parameter";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x4201) {
    *s_out = "DW_TAG_SUN_function_template";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x4202) {
    *s_out = "DW_TAG_SUN_class_template";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x4203) {
    *s_out = "DW_TAG_SUN_struct_template";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x4204) {
    *s_out = "DW_TAG_SUN_union_template";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x4205) {
    *s_out = "DW_TAG_SUN_indirect_inheritance";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x4206) {
    *s_out = "DW_TAG_SUN_codeflags";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x4207) {
    *s_out = "DW_TAG_SUN_memop_info";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x4208) {
    *s_out = "DW_TAG_SUN_omp_child_func";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x4209) {
    *s_out = "DW_TAG_SUN_rtti_descriptor";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x420a) {
    *s_out = "DW_TAG_SUN_dtor_info";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x420b) {
    *s_out = "DW_TAG_SUN_dtor";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x420c) {
    *s_out = "DW_TAG_SUN_f90_interface";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x420d) {
    *s_out = "DW_TAG_SUN_fortran_vax_structure";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x42ff) {
    *s_out = "DW_TAG_SUN_hi";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x5101) {
    *s_out = "DW_TAG_ALTIUM_circ_type";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x5102) {
    *s_out = "DW_TAG_ALTIUM_mwa_circ_type";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x5103) {
    *s_out = "DW_TAG_ALTIUM_rev_carry_type";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x5111) {
    *s_out = "DW_TAG_ALTIUM_rom";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x6000) {
    *s_out = "DW_TAG_LLVM_annotation";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x8004) {
    *s_out = "DW_TAG_ghs_namespace";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x8005) {
    *s_out = "DW_TAG_ghs_using_namespace";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x8006) {
    *s_out = "DW_TAG_ghs_using_declaration";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x8007) {
    *s_out = "DW_TAG_ghs_template_templ_param";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x8765) {
    *s_out = "DW_TAG_upc_shared_type";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x8766) {
    *s_out = "DW_TAG_upc_strict_type";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x8767) {
    *s_out = "DW_TAG_upc_relaxed_type";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0xa000) {
    *s_out = "DW_TAG_PGI_kanji_type";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0xa020) {
    *s_out = "DW_TAG_PGI_interface_block";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0xb000) {
    *s_out = "DW_TAG_BORLAND_property";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0xb001) {
    *s_out = "DW_TAG_BORLAND_Delphi_string";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0xb002) {
    *s_out = "DW_TAG_BORLAND_Delphi_dynamic_array";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0xb003) {
    *s_out = "DW_TAG_BORLAND_Delphi_set";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0xb004) {
    *s_out = "DW_TAG_BORLAND_Delphi_variant";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0xffff) {
    *s_out = "DW_TAG_hi_user";
    s_out_local._4_4_ = 0;
  }
  else {
    s_out_local._4_4_ = -1;
  }
  return s_out_local._4_4_;
}

Assistant:

int
dwarf_get_TAG_name (unsigned int val,
    const char ** s_out)
{
    switch (val) {
    case DW_TAG_array_type:
        *s_out = "DW_TAG_array_type";
        return DW_DLV_OK;
    case DW_TAG_class_type:
        *s_out = "DW_TAG_class_type";
        return DW_DLV_OK;
    case DW_TAG_entry_point:
        *s_out = "DW_TAG_entry_point";
        return DW_DLV_OK;
    case DW_TAG_enumeration_type:
        *s_out = "DW_TAG_enumeration_type";
        return DW_DLV_OK;
    case DW_TAG_formal_parameter:
        *s_out = "DW_TAG_formal_parameter";
        return DW_DLV_OK;
    case DW_TAG_imported_declaration:
        *s_out = "DW_TAG_imported_declaration";
        return DW_DLV_OK;
    case DW_TAG_label:
        *s_out = "DW_TAG_label";
        return DW_DLV_OK;
    case DW_TAG_lexical_block:
        *s_out = "DW_TAG_lexical_block";
        return DW_DLV_OK;
    case DW_TAG_member:
        *s_out = "DW_TAG_member";
        return DW_DLV_OK;
    case DW_TAG_pointer_type:
        *s_out = "DW_TAG_pointer_type";
        return DW_DLV_OK;
    case DW_TAG_reference_type:
        *s_out = "DW_TAG_reference_type";
        return DW_DLV_OK;
    case DW_TAG_compile_unit:
        *s_out = "DW_TAG_compile_unit";
        return DW_DLV_OK;
    case DW_TAG_string_type:
        *s_out = "DW_TAG_string_type";
        return DW_DLV_OK;
    case DW_TAG_structure_type:
        *s_out = "DW_TAG_structure_type";
        return DW_DLV_OK;
    case DW_TAG_subroutine_type:
        *s_out = "DW_TAG_subroutine_type";
        return DW_DLV_OK;
    case DW_TAG_typedef:
        *s_out = "DW_TAG_typedef";
        return DW_DLV_OK;
    case DW_TAG_union_type:
        *s_out = "DW_TAG_union_type";
        return DW_DLV_OK;
    case DW_TAG_unspecified_parameters:
        *s_out = "DW_TAG_unspecified_parameters";
        return DW_DLV_OK;
    case DW_TAG_variant:
        *s_out = "DW_TAG_variant";
        return DW_DLV_OK;
    case DW_TAG_common_block:
        *s_out = "DW_TAG_common_block";
        return DW_DLV_OK;
    case DW_TAG_common_inclusion:
        *s_out = "DW_TAG_common_inclusion";
        return DW_DLV_OK;
    case DW_TAG_inheritance:
        *s_out = "DW_TAG_inheritance";
        return DW_DLV_OK;
    case DW_TAG_inlined_subroutine:
        *s_out = "DW_TAG_inlined_subroutine";
        return DW_DLV_OK;
    case DW_TAG_module:
        *s_out = "DW_TAG_module";
        return DW_DLV_OK;
    case DW_TAG_ptr_to_member_type:
        *s_out = "DW_TAG_ptr_to_member_type";
        return DW_DLV_OK;
    case DW_TAG_set_type:
        *s_out = "DW_TAG_set_type";
        return DW_DLV_OK;
    case DW_TAG_subrange_type:
        *s_out = "DW_TAG_subrange_type";
        return DW_DLV_OK;
    case DW_TAG_with_stmt:
        *s_out = "DW_TAG_with_stmt";
        return DW_DLV_OK;
    case DW_TAG_access_declaration:
        *s_out = "DW_TAG_access_declaration";
        return DW_DLV_OK;
    case DW_TAG_base_type:
        *s_out = "DW_TAG_base_type";
        return DW_DLV_OK;
    case DW_TAG_catch_block:
        *s_out = "DW_TAG_catch_block";
        return DW_DLV_OK;
    case DW_TAG_const_type:
        *s_out = "DW_TAG_const_type";
        return DW_DLV_OK;
    case DW_TAG_constant:
        *s_out = "DW_TAG_constant";
        return DW_DLV_OK;
    case DW_TAG_enumerator:
        *s_out = "DW_TAG_enumerator";
        return DW_DLV_OK;
    case DW_TAG_file_type:
        *s_out = "DW_TAG_file_type";
        return DW_DLV_OK;
    case DW_TAG_friend:
        *s_out = "DW_TAG_friend";
        return DW_DLV_OK;
    case DW_TAG_namelist:
        *s_out = "DW_TAG_namelist";
        return DW_DLV_OK;
    case DW_TAG_namelist_item:
        *s_out = "DW_TAG_namelist_item";
        return DW_DLV_OK;
    /*  Skipping alternate spelling of value
        0x2c. DW_TAG_namelist_items */
    case DW_TAG_packed_type:
        *s_out = "DW_TAG_packed_type";
        return DW_DLV_OK;
    case DW_TAG_subprogram:
        *s_out = "DW_TAG_subprogram";
        return DW_DLV_OK;
    case DW_TAG_template_type_parameter:
        *s_out = "DW_TAG_template_type_parameter";
        return DW_DLV_OK;
    /*  Skipping alternate spelling of value
        0x2f. DW_TAG_template_type_param */
    case DW_TAG_template_value_parameter:
        *s_out = "DW_TAG_template_value_parameter";
        return DW_DLV_OK;
    /*  Skipping alternate spelling of value
        0x30. DW_TAG_template_value_param */
    case DW_TAG_thrown_type:
        *s_out = "DW_TAG_thrown_type";
        return DW_DLV_OK;
    case DW_TAG_try_block:
        *s_out = "DW_TAG_try_block";
        return DW_DLV_OK;
    case DW_TAG_variant_part:
        *s_out = "DW_TAG_variant_part";
        return DW_DLV_OK;
    case DW_TAG_variable:
        *s_out = "DW_TAG_variable";
        return DW_DLV_OK;
    case DW_TAG_volatile_type:
        *s_out = "DW_TAG_volatile_type";
        return DW_DLV_OK;
    case DW_TAG_dwarf_procedure:
        *s_out = "DW_TAG_dwarf_procedure";
        return DW_DLV_OK;
    case DW_TAG_restrict_type:
        *s_out = "DW_TAG_restrict_type";
        return DW_DLV_OK;
    case DW_TAG_interface_type:
        *s_out = "DW_TAG_interface_type";
        return DW_DLV_OK;
    case DW_TAG_namespace:
        *s_out = "DW_TAG_namespace";
        return DW_DLV_OK;
    case DW_TAG_imported_module:
        *s_out = "DW_TAG_imported_module";
        return DW_DLV_OK;
    case DW_TAG_unspecified_type:
        *s_out = "DW_TAG_unspecified_type";
        return DW_DLV_OK;
    case DW_TAG_partial_unit:
        *s_out = "DW_TAG_partial_unit";
        return DW_DLV_OK;
    case DW_TAG_imported_unit:
        *s_out = "DW_TAG_imported_unit";
        return DW_DLV_OK;
    case DW_TAG_mutable_type:
        *s_out = "DW_TAG_mutable_type";
        return DW_DLV_OK;
    case DW_TAG_condition:
        *s_out = "DW_TAG_condition";
        return DW_DLV_OK;
    case DW_TAG_shared_type:
        *s_out = "DW_TAG_shared_type";
        return DW_DLV_OK;
    case DW_TAG_type_unit:
        *s_out = "DW_TAG_type_unit";
        return DW_DLV_OK;
    case DW_TAG_rvalue_reference_type:
        *s_out = "DW_TAG_rvalue_reference_type";
        return DW_DLV_OK;
    case DW_TAG_template_alias:
        *s_out = "DW_TAG_template_alias";
        return DW_DLV_OK;
    case DW_TAG_coarray_type:
        *s_out = "DW_TAG_coarray_type";
        return DW_DLV_OK;
    case DW_TAG_generic_subrange:
        *s_out = "DW_TAG_generic_subrange";
        return DW_DLV_OK;
    case DW_TAG_dynamic_type:
        *s_out = "DW_TAG_dynamic_type";
        return DW_DLV_OK;
    case DW_TAG_atomic_type:
        *s_out = "DW_TAG_atomic_type";
        return DW_DLV_OK;
    case DW_TAG_call_site:
        *s_out = "DW_TAG_call_site";
        return DW_DLV_OK;
    case DW_TAG_call_site_parameter:
        *s_out = "DW_TAG_call_site_parameter";
        return DW_DLV_OK;
    case DW_TAG_skeleton_unit:
        *s_out = "DW_TAG_skeleton_unit";
        return DW_DLV_OK;
    case DW_TAG_immutable_type:
        *s_out = "DW_TAG_immutable_type";
        return DW_DLV_OK;
    case DW_TAG_TI_far_type:
        *s_out = "DW_TAG_TI_far_type";
        return DW_DLV_OK;
    /*  Skipping alternate spelling of value
        0x4080. DW_TAG_lo_user */
    case DW_TAG_MIPS_loop:
        *s_out = "DW_TAG_MIPS_loop";
        return DW_DLV_OK;
    /*  Skipping alternate spelling of value
        0x4081. DW_TAG_TI_near_type */
    case DW_TAG_TI_assign_register:
        *s_out = "DW_TAG_TI_assign_register";
        return DW_DLV_OK;
    case DW_TAG_TI_ioport_type:
        *s_out = "DW_TAG_TI_ioport_type";
        return DW_DLV_OK;
    case DW_TAG_TI_restrict_type:
        *s_out = "DW_TAG_TI_restrict_type";
        return DW_DLV_OK;
    case DW_TAG_TI_onchip_type:
        *s_out = "DW_TAG_TI_onchip_type";
        return DW_DLV_OK;
    case DW_TAG_HP_array_descriptor:
        *s_out = "DW_TAG_HP_array_descriptor";
        return DW_DLV_OK;
    case DW_TAG_format_label:
        *s_out = "DW_TAG_format_label";
        return DW_DLV_OK;
    case DW_TAG_function_template:
        *s_out = "DW_TAG_function_template";
        return DW_DLV_OK;
    case DW_TAG_class_template:
        *s_out = "DW_TAG_class_template";
        return DW_DLV_OK;
    case DW_TAG_GNU_BINCL:
        *s_out = "DW_TAG_GNU_BINCL";
        return DW_DLV_OK;
    case DW_TAG_GNU_EINCL:
        *s_out = "DW_TAG_GNU_EINCL";
        return DW_DLV_OK;
    case DW_TAG_GNU_template_template_parameter:
        *s_out = "DW_TAG_GNU_template_template_parameter";
        return DW_DLV_OK;
    /*  Skipping alternate spelling of value
        0x4106. DW_TAG_GNU_template_template_param */
    case DW_TAG_GNU_template_parameter_pack:
        *s_out = "DW_TAG_GNU_template_parameter_pack";
        return DW_DLV_OK;
    case DW_TAG_GNU_formal_parameter_pack:
        *s_out = "DW_TAG_GNU_formal_parameter_pack";
        return DW_DLV_OK;
    case DW_TAG_GNU_call_site:
        *s_out = "DW_TAG_GNU_call_site";
        return DW_DLV_OK;
    case DW_TAG_GNU_call_site_parameter:
        *s_out = "DW_TAG_GNU_call_site_parameter";
        return DW_DLV_OK;
    case DW_TAG_SUN_function_template:
        *s_out = "DW_TAG_SUN_function_template";
        return DW_DLV_OK;
    case DW_TAG_SUN_class_template:
        *s_out = "DW_TAG_SUN_class_template";
        return DW_DLV_OK;
    case DW_TAG_SUN_struct_template:
        *s_out = "DW_TAG_SUN_struct_template";
        return DW_DLV_OK;
    case DW_TAG_SUN_union_template:
        *s_out = "DW_TAG_SUN_union_template";
        return DW_DLV_OK;
    case DW_TAG_SUN_indirect_inheritance:
        *s_out = "DW_TAG_SUN_indirect_inheritance";
        return DW_DLV_OK;
    case DW_TAG_SUN_codeflags:
        *s_out = "DW_TAG_SUN_codeflags";
        return DW_DLV_OK;
    case DW_TAG_SUN_memop_info:
        *s_out = "DW_TAG_SUN_memop_info";
        return DW_DLV_OK;
    case DW_TAG_SUN_omp_child_func:
        *s_out = "DW_TAG_SUN_omp_child_func";
        return DW_DLV_OK;
    case DW_TAG_SUN_rtti_descriptor:
        *s_out = "DW_TAG_SUN_rtti_descriptor";
        return DW_DLV_OK;
    case DW_TAG_SUN_dtor_info:
        *s_out = "DW_TAG_SUN_dtor_info";
        return DW_DLV_OK;
    case DW_TAG_SUN_dtor:
        *s_out = "DW_TAG_SUN_dtor";
        return DW_DLV_OK;
    case DW_TAG_SUN_f90_interface:
        *s_out = "DW_TAG_SUN_f90_interface";
        return DW_DLV_OK;
    case DW_TAG_SUN_fortran_vax_structure:
        *s_out = "DW_TAG_SUN_fortran_vax_structure";
        return DW_DLV_OK;
    case DW_TAG_SUN_hi:
        *s_out = "DW_TAG_SUN_hi";
        return DW_DLV_OK;
    case DW_TAG_ALTIUM_circ_type:
        *s_out = "DW_TAG_ALTIUM_circ_type";
        return DW_DLV_OK;
    case DW_TAG_ALTIUM_mwa_circ_type:
        *s_out = "DW_TAG_ALTIUM_mwa_circ_type";
        return DW_DLV_OK;
    case DW_TAG_ALTIUM_rev_carry_type:
        *s_out = "DW_TAG_ALTIUM_rev_carry_type";
        return DW_DLV_OK;
    case DW_TAG_ALTIUM_rom:
        *s_out = "DW_TAG_ALTIUM_rom";
        return DW_DLV_OK;
    case DW_TAG_LLVM_annotation:
        *s_out = "DW_TAG_LLVM_annotation";
        return DW_DLV_OK;
    case DW_TAG_ghs_namespace:
        *s_out = "DW_TAG_ghs_namespace";
        return DW_DLV_OK;
    case DW_TAG_ghs_using_namespace:
        *s_out = "DW_TAG_ghs_using_namespace";
        return DW_DLV_OK;
    case DW_TAG_ghs_using_declaration:
        *s_out = "DW_TAG_ghs_using_declaration";
        return DW_DLV_OK;
    case DW_TAG_ghs_template_templ_param:
        *s_out = "DW_TAG_ghs_template_templ_param";
        return DW_DLV_OK;
    case DW_TAG_upc_shared_type:
        *s_out = "DW_TAG_upc_shared_type";
        return DW_DLV_OK;
    case DW_TAG_upc_strict_type:
        *s_out = "DW_TAG_upc_strict_type";
        return DW_DLV_OK;
    case DW_TAG_upc_relaxed_type:
        *s_out = "DW_TAG_upc_relaxed_type";
        return DW_DLV_OK;
    case DW_TAG_PGI_kanji_type:
        *s_out = "DW_TAG_PGI_kanji_type";
        return DW_DLV_OK;
    case DW_TAG_PGI_interface_block:
        *s_out = "DW_TAG_PGI_interface_block";
        return DW_DLV_OK;
    case DW_TAG_BORLAND_property:
        *s_out = "DW_TAG_BORLAND_property";
        return DW_DLV_OK;
    case DW_TAG_BORLAND_Delphi_string:
        *s_out = "DW_TAG_BORLAND_Delphi_string";
        return DW_DLV_OK;
    case DW_TAG_BORLAND_Delphi_dynamic_array:
        *s_out = "DW_TAG_BORLAND_Delphi_dynamic_array";
        return DW_DLV_OK;
    case DW_TAG_BORLAND_Delphi_set:
        *s_out = "DW_TAG_BORLAND_Delphi_set";
        return DW_DLV_OK;
    case DW_TAG_BORLAND_Delphi_variant:
        *s_out = "DW_TAG_BORLAND_Delphi_variant";
        return DW_DLV_OK;
    case DW_TAG_hi_user:
        *s_out = "DW_TAG_hi_user";
        return DW_DLV_OK;
    default: break;
    }
    return DW_DLV_NO_ENTRY;
}